

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  Builder value;
  ListBuilder builder;
  ListBuilder builder_00;
  Builder value_00;
  Builder value_01;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar1;
  bool bVar2;
  ElementSize elementSize;
  Which WVar3;
  uint uVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Builder value_02;
  Fault local_208;
  Fault f_2;
  ListBuilder local_1e8;
  Type local_1c0;
  Builder local_1b0;
  Schema local_178;
  StructSize local_16c;
  PointerBuilder local_168;
  ListBuilder local_150;
  Type local_128;
  Builder local_118;
  undefined1 local_e0 [8];
  ListSchema elementType;
  PointerBuilder local_a8;
  Builder local_90;
  Fault local_78;
  Fault f_1;
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  uint size_local;
  uint index_local;
  Builder *this_local;
  
  _kjCondition._32_4_ = in_ECX;
  _kjCondition._36_4_ = in_EDX;
  local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception._4_4_ = size((Builder *)ctx);
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (DebugExpression<unsigned_int&> *)&local_50,(uint *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar2) {
    WVar3 = ListSchema::whichElementType((ListSchema *)ctx);
    switch(WVar3) {
    case VOID:
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case FLOAT32:
    case FLOAT64:
    case ENUM:
    case STRUCT:
    case INTERFACE:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x4f4,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
                 (char (*) [25])"Expected a list or blob.");
      kj::_::Debug::Fault::fatal(&local_78);
    case TEXT:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getPointerElement(&local_a8,(ListBuilder *)(ctx + 0x10),uVar4);
      uVar4 = bounded<unsigned_int>(_kjCondition._32_4_);
      capnp::_::PointerBuilder::initBlob<capnp::Text>(&local_90,&local_a8,uVar4);
      value.content.ptr = local_90.content.ptr;
      value._0_8_ = local_90._0_8_;
      value.content.size_ = local_90.content.size_;
      DynamicValue::Builder::Builder((Builder *)this,value);
      break;
    case DATA:
      uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getPointerElement
                ((PointerBuilder *)&elementType.elementType.field_4,(ListBuilder *)(ctx + 0x10),
                 uVar4);
      uVar4 = bounded<unsigned_int>(_kjCondition._32_4_);
      value_02 = capnp::_::PointerBuilder::initBlob<capnp::Data>
                           ((PointerBuilder *)&elementType.elementType.field_4,uVar4);
      DynamicValue::Builder::Builder((Builder *)this,value_02);
      break;
    case LIST:
      _local_e0 = (Type)ListSchema::getListElementType((ListSchema *)ctx);
      WVar3 = ListSchema::whichElementType((ListSchema *)local_e0);
      TVar1 = _local_e0;
      _local_e0 = TVar1;
      if (WVar3 == STRUCT) {
        local_128.baseType = local_e0._0_2_;
        local_128.listDepth = local_e0[2];
        local_128.isImplicitParam = (bool)local_e0[3];
        local_128.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_e0._4_2_;
        local_128._6_2_ = local_e0._6_2_;
        local_128.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
        uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
        capnp::_::ListBuilder::getPointerElement(&local_168,(ListBuilder *)(ctx + 0x10),uVar4);
        uVar4 = bounded<unsigned_int>(_kjCondition._32_4_);
        local_178.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_e0)
        ;
        local_16c = anon_unknown_70::structSizeFromSchema((StructSchema)local_178.raw);
        capnp::_::PointerBuilder::initStructList(&local_150,&local_168,uVar4,local_16c);
        schema_00.elementType.field_4.schema = local_128.field_4.schema;
        schema_00.elementType.baseType = local_128.baseType;
        schema_00.elementType.listDepth = local_128.listDepth;
        schema_00.elementType.isImplicitParam = local_128.isImplicitParam;
        schema_00.elementType.field_3 = local_128.field_3;
        schema_00.elementType._6_2_ = local_128._6_2_;
        builder.capTable = local_150.capTable;
        builder.segment = local_150.segment;
        builder.ptr = local_150.ptr;
        builder.elementCount = local_150.elementCount;
        builder.step = local_150.step;
        builder.structDataSize = local_150.structDataSize;
        builder.structPointerCount = local_150.structPointerCount;
        builder.elementSize = local_150.elementSize;
        builder._39_1_ = local_150._39_1_;
        Builder(&local_118,schema_00,builder);
        value_00.schema.elementType.field_4.schema = local_118.schema.elementType.field_4.schema;
        value_00.schema.elementType.baseType = local_118.schema.elementType.baseType;
        value_00.schema.elementType.listDepth = local_118.schema.elementType.listDepth;
        value_00.schema.elementType.isImplicitParam = local_118.schema.elementType.isImplicitParam;
        value_00.schema.elementType.field_3 = local_118.schema.elementType.field_3;
        value_00.schema.elementType._6_2_ = local_118.schema.elementType._6_2_;
        value_00.builder.segment = local_118.builder.segment;
        value_00.builder.capTable = local_118.builder.capTable;
        value_00.builder.ptr = local_118.builder.ptr;
        value_00.builder.elementCount = local_118.builder.elementCount;
        value_00.builder.step = local_118.builder.step;
        value_00.builder.structDataSize = local_118.builder.structDataSize;
        value_00.builder.structPointerCount = local_118.builder.structPointerCount;
        value_00.builder.elementSize = local_118.builder.elementSize;
        value_00.builder._39_1_ = local_118.builder._39_1_;
        DynamicValue::Builder::Builder((Builder *)this,value_00);
      }
      else {
        local_1c0.baseType = local_e0._0_2_;
        local_1c0.listDepth = local_e0[2];
        local_1c0.isImplicitParam = (bool)local_e0[3];
        local_1c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_e0._4_2_;
        local_1c0._6_2_ = local_e0._6_2_;
        local_1c0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
        uVar4 = bounded<unsigned_int>(_kjCondition._36_4_);
        capnp::_::ListBuilder::getPointerElement
                  ((PointerBuilder *)&f_2,(ListBuilder *)(ctx + 0x10),uVar4);
        WVar3 = ListSchema::whichElementType((ListSchema *)local_e0);
        elementSize = anon_unknown_70::elementSizeFor(WVar3);
        uVar4 = bounded<unsigned_int>(_kjCondition._32_4_);
        capnp::_::PointerBuilder::initList(&local_1e8,(PointerBuilder *)&f_2,elementSize,uVar4);
        schema.elementType.field_4.schema = local_1c0.field_4.schema;
        schema.elementType.baseType = local_1c0.baseType;
        schema.elementType.listDepth = local_1c0.listDepth;
        schema.elementType.isImplicitParam = local_1c0.isImplicitParam;
        schema.elementType.field_3 = local_1c0.field_3;
        schema.elementType._6_2_ = local_1c0._6_2_;
        builder_00.capTable = local_1e8.capTable;
        builder_00.segment = local_1e8.segment;
        builder_00.ptr = local_1e8.ptr;
        builder_00.elementCount = local_1e8.elementCount;
        builder_00.step = local_1e8.step;
        builder_00.structDataSize = local_1e8.structDataSize;
        builder_00.structPointerCount = local_1e8.structPointerCount;
        builder_00.elementSize = local_1e8.elementSize;
        builder_00._39_1_ = local_1e8._39_1_;
        Builder(&local_1b0,schema,builder_00);
        value_01.schema.elementType.field_4.schema = local_1b0.schema.elementType.field_4.schema;
        value_01.schema.elementType.baseType = local_1b0.schema.elementType.baseType;
        value_01.schema.elementType.listDepth = local_1b0.schema.elementType.listDepth;
        value_01.schema.elementType.isImplicitParam = local_1b0.schema.elementType.isImplicitParam;
        value_01.schema.elementType.field_3 = local_1b0.schema.elementType.field_3;
        value_01.schema.elementType._6_2_ = local_1b0.schema.elementType._6_2_;
        value_01.builder.segment = local_1b0.builder.segment;
        value_01.builder.capTable = local_1b0.builder.capTable;
        value_01.builder.ptr = local_1b0.builder.ptr;
        value_01.builder.elementCount = local_1b0.builder.elementCount;
        value_01.builder.step = local_1b0.builder.step;
        value_01.builder.structDataSize = local_1b0.builder.structDataSize;
        value_01.builder.structPointerCount = local_1b0.builder.structPointerCount;
        value_01.builder.elementSize = local_1b0.builder.elementSize;
        value_01.builder._39_1_ = local_1b0.builder._39_1_;
        DynamicValue::Builder::Builder((Builder *)this,value_01);
      }
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x510,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal(&local_208);
    default:
      DynamicValue::Builder::Builder((Builder *)this,(void *)0x0);
    }
    return (int)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x4e2,FAILED,"index < this->size()","_kjCondition,\"List index out-of-bounds.\"",
             (DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (char (*) [26])"List index out-of-bounds.");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}